

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.cc
# Opt level: O2

void test_96(QPDF *pdf,char *arg2)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_38;
  QPDFObjectHandle s;
  
  operator____qpdf((char *)&s,0x14183a);
  QPDFObjectHandle::unparseBinary_abi_cxx11_();
  bVar1 = std::operator==(&bStack_38,"<043821385104>");
  if (!bVar1) {
    __assert_fail("s.unparseBinary() == \"<043821385104>\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                  ,0xd60,"void test_96(QPDF &, const char *)");
  }
  std::__cxx11::string::~string((string *)&bStack_38);
  operator____qpdf((char *)&bStack_38,0x1418a2);
  std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&s,
             (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&bStack_38);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&bStack_38._M_string_length);
  QPDFObjectHandle::unparseBinary_abi_cxx11_();
  bVar1 = std::operator==(&bStack_38,"<043821385121>");
  if (!bVar1) {
    __assert_fail("s.unparseBinary() == \"<043821385121>\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                  ,0xd62,"void test_96(QPDF &, const char *)");
  }
  std::__cxx11::string::~string((string *)&bStack_38);
  operator____qpdf((char *)&bStack_38,0x1418e8);
  std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&s,
             (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&bStack_38);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&bStack_38._M_string_length);
  QPDFObjectHandle::unparseBinary_abi_cxx11_();
  bVar1 = std::operator==(&bStack_38,"<a0>");
  if (!bVar1) {
    __assert_fail("s.unparseBinary() == \"<a0>\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                  ,0xd64,"void test_96(QPDF &, const char *)");
  }
  std::__cxx11::string::~string((string *)&bStack_38);
  operator____qpdf((char *)&bStack_38,0x14190d);
  std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&s,
             (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&bStack_38);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&bStack_38._M_string_length);
  QPDFObjectHandle::unparseBinary_abi_cxx11_();
  bVar1 = std::operator==(&bStack_38,"<abc0>");
  if (bVar1) {
    std::__cxx11::string::~string((string *)&bStack_38);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&s.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    return;
  }
  __assert_fail("s.unparseBinary() == \"<abc0>\"",
                "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc",
                0xd66,"void test_96(QPDF &, const char *)");
}

Assistant:

static void
test_96(QPDF& pdf, char const* arg2)
{
    // Test edge cases with quoted characters and string parsing.

    auto s = R"((\48\418\121\4))"_qpdf;
    assert(s.unparseBinary() == "<043821385104>");
    s = R"((\48\418\121\41))"_qpdf;
    assert(s.unparseBinary() == "<043821385121>");
    s = R"(<a>)"_qpdf;
    assert(s.unparseBinary() == "<a0>");
    s = R"(<abc>)"_qpdf;
    assert(s.unparseBinary() == "<abc0>");
}